

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Status leveldb::ReadBlock(RandomAccessFile *file,Options *dbOptions,ReadOptions *options,
                         BlockHandle *handle,BlockContents *result)

{
  Slice *d;
  bool bVar1;
  uint32_t masked_crc;
  uint64_t uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t __n;
  byte *in_RCX;
  long in_RDX;
  long *in_RSI;
  Status *in_RDI;
  BlockHandle *in_R8;
  undefined8 *in_R9;
  char *ubuf;
  bool success;
  string buffer;
  Compressor **c;
  Compressor **__end2;
  Compressor **__begin2;
  Compressor *(*__range2) [256];
  Compressor *compressor;
  uchar compressionID;
  uint32_t actual;
  uint32_t crc;
  char *data;
  Status s;
  Slice contents;
  char *buf;
  size_t n;
  Status *in_stack_fffffffffffffde8;
  char *s_00;
  Slice *in_stack_fffffffffffffdf0;
  Slice *in_stack_fffffffffffffdf8;
  Slice local_1b8 [2];
  Slice local_198;
  Slice *local_188;
  byte local_179;
  string local_178 [32];
  string local_158 [32];
  Slice local_138 [2];
  long *local_118;
  long *local_110;
  long *local_108;
  long *local_100;
  long *local_f8;
  Slice local_f0;
  Slice local_e0;
  byte local_c9;
  Slice local_c8 [2];
  uint32_t local_a0;
  uint32_t local_9c;
  char *local_98;
  Slice local_90 [2];
  uint local_6c;
  Status local_68;
  Slice local_60;
  char *local_50;
  uint64_t local_48;
  Slice local_40;
  undefined8 *local_30;
  BlockHandle *local_28;
  byte *local_20;
  long local_18;
  long *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Slice::Slice(&local_40);
  *local_30 = local_40.data_;
  local_30[1] = local_40.size_;
  *(undefined1 *)(local_30 + 2) = 0;
  *(undefined1 *)((long)local_30 + 0x11) = 0;
  local_48 = BlockHandle::size(local_28);
  local_50 = (char *)operator_new__(local_48 + 5);
  Slice::Slice(&local_60);
  uVar2 = BlockHandle::offset(local_28);
  (**(code **)(*local_10 + 0x10))(&local_68,local_10,uVar2,local_48 + 5,&local_60,local_50);
  bVar1 = Status::ok(&local_68);
  if (bVar1) {
    sVar3 = Slice::size(&local_60);
    if (sVar3 == local_48 + 5) {
      local_98 = Slice::data(&local_60);
      if ((*local_20 & 1) != 0) {
        masked_crc = DecodeFixed32(local_98 + local_48 + 1);
        local_9c = crc32c::Unmask(masked_crc);
        local_a0 = crc32c::Value((char *)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8
                                );
        if (local_a0 != local_9c) {
          if (local_50 != (char *)0x0) {
            operator_delete__(local_50);
          }
          Slice::Slice(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
          Slice::Slice(local_c8);
          Status::Corruption(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
          Status::operator=((Status *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          Status::~Status((Status *)in_stack_fffffffffffffdf0);
          Status::Status(in_RDI,&local_68);
          local_6c = 1;
          goto LAB_00135f4d;
        }
      }
      local_c9 = local_98[local_48];
      if (local_c9 == 0) {
        if (local_98 == local_50) {
          Slice::Slice(&local_f0,local_50,local_48);
          *local_30 = local_f0.data_;
          local_30[1] = local_f0.size_;
          *(undefined1 *)((long)local_30 + 0x11) = 1;
          *(undefined1 *)(local_30 + 2) = 1;
        }
        else {
          if (local_50 != (char *)0x0) {
            operator_delete__(local_50);
          }
          Slice::Slice(&local_e0,local_98,local_48);
          *local_30 = local_e0.data_;
          local_30[1] = local_e0.size_;
          *(undefined1 *)((long)local_30 + 0x11) = 0;
          *(undefined1 *)(local_30 + 2) = 0;
        }
      }
      else {
        local_f8 = (long *)0x0;
        local_110 = (long *)(local_18 + 0x850);
        local_100 = (long *)(local_18 + 0x50);
        for (local_108 = local_100; local_108 != local_110; local_108 = local_108 + 1) {
          local_118 = local_108;
          if ((*local_108 == 0) || ((int)*(char *)(*local_108 + 0x18) == (uint)local_c9)) {
            local_f8 = (long *)*local_108;
            break;
          }
        }
        if (local_f8 == (long *)0x0) {
          if (local_50 != (char *)0x0) {
            operator_delete__(local_50);
          }
          Slice::Slice(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
          Slice::Slice(local_138);
          Status::NotSupported(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
          local_6c = 1;
          goto LAB_00135f4d;
        }
        std::__cxx11::string::string(local_158);
        if (*(long *)(local_20 + 0x10) != 0) {
          (**(code **)(**(long **)(local_20 + 0x10) + 0x10))(local_178);
          std::__cxx11::string::operator=(local_158,local_178);
          std::__cxx11::string::~string(local_178);
        }
        local_179 = (**(code **)(*local_f8 + 0x18))(local_f8,local_98,local_48,local_158);
        local_179 = local_179 & 1;
        if (local_179 != 0) {
          uVar4 = std::__cxx11::string::size();
          in_stack_fffffffffffffdf0 = (Slice *)operator_new__(uVar4);
          local_188 = in_stack_fffffffffffffdf0;
          in_stack_fffffffffffffdf8 = (Slice *)std::__cxx11::string::data();
          __n = std::__cxx11::string::size();
          memcpy(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,__n);
          d = local_188;
          sVar3 = std::__cxx11::string::size();
          Slice::Slice(&local_198,(char *)d,sVar3);
          *local_30 = local_198.data_;
          local_30[1] = local_198.size_;
          *(undefined1 *)((long)local_30 + 0x11) = 1;
          *(undefined1 *)(local_30 + 2) = 1;
        }
        s_00 = local_50;
        if (local_50 != (char *)0x0) {
          operator_delete__(local_50);
        }
        if (*(long *)(local_20 + 0x10) != 0) {
          (**(code **)(**(long **)(local_20 + 0x10) + 0x18))(*(long **)(local_20 + 0x10),local_158);
        }
        bVar1 = (local_179 & 1) == 0;
        if (bVar1) {
          Slice::Slice(in_stack_fffffffffffffdf0,s_00);
          Slice::Slice(local_1b8);
          Status::Corruption(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        }
        local_6c = (uint)bVar1;
        std::__cxx11::string::~string(local_158);
        if (local_6c != 0) goto LAB_00135f4d;
      }
      Status::OK();
      local_6c = 1;
    }
    else {
      if (local_50 != (char *)0x0) {
        operator_delete__(local_50);
      }
      Slice::Slice(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
      Slice::Slice(local_90);
      Status::Corruption(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      local_6c = 1;
    }
  }
  else {
    if (local_50 != (char *)0x0) {
      operator_delete__(local_50);
    }
    Status::Status(in_RDI,&local_68);
    local_6c = 1;
  }
LAB_00135f4d:
  Status::~Status((Status *)in_stack_fffffffffffffdf0);
  return (Status)(char *)in_RDI;
}

Assistant:

Status ReadBlock(RandomAccessFile* file, const Options& dbOptions, const ReadOptions& options,
                 const BlockHandle& handle, BlockContents* result) {
  result->data = Slice();
  result->cachable = false;
  result->heap_allocated = false;

  // Read the block contents as well as the type/crc footer.
  // See table_builder.cc for the code that built this structure.
  size_t n = static_cast<size_t>(handle.size());
  char* buf = new char[n + kBlockTrailerSize];
  Slice contents;
  Status s = file->Read(handle.offset(), n + kBlockTrailerSize, &contents, buf);
  if (!s.ok()) {
    delete[] buf;
    return s;
  }
  if (contents.size() != n + kBlockTrailerSize) {
    delete[] buf;
    return Status::Corruption("truncated block read");
  }

  // Check the crc of the type and the block contents
  const char* data = contents.data();  // Pointer to where Read put the data
  if (options.verify_checksums) {
    const uint32_t crc = crc32c::Unmask(DecodeFixed32(data + n + 1));
    const uint32_t actual = crc32c::Value(data, n + 1);
    if (actual != crc) {
      delete[] buf;
      s = Status::Corruption("block checksum mismatch");
      return s;
    }
  }

		unsigned char compressionID = data[n];

		if (compressionID == 0) {
			if (data != buf) {
				// File implementation gave us pointer to some other data.
				// Use it directly under the assumption that it will be live
				// while the file is open.
				delete[] buf;
				result->data = Slice(data, n);
				result->heap_allocated = false;
				result->cachable = false;  // Do not double-cache
			}
			else {
				result->data = Slice(buf, n);
				result->heap_allocated = true;
				result->cachable = true;
			}
		}
		else {

			//find the required compressor
			Compressor* compressor = nullptr;
			for (auto& c : dbOptions.compressors) {
				if (!c || c->uniqueCompressionID == compressionID) {
					compressor = c;
					break;
				}
			}

			if (compressor == nullptr) {
				delete[] buf;
				return Status::NotSupported("encountered a block compressed with an unknown decompressor");
			}

			std::string buffer;
			if (options.decompress_allocator) {
				buffer = options.decompress_allocator->get();
			}

			bool success = compressor->decompress(data, n, buffer);

			if (success) {
				auto ubuf = new char[buffer.size()];
				memcpy(ubuf, buffer.data(), buffer.size());
				result->data = Slice(ubuf, buffer.size());
				result->heap_allocated = true;
				result->cachable = true;
			}

			delete[] buf;
			
			if (options.decompress_allocator) {
				options.decompress_allocator->release(std::move(buffer));
			}

			if (!success) {
				return Status::Corruption("corrupted compressed block contents");
			}
		}

		return Status::OK();
	}